

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSource.cpp
# Opt level: O0

bool __thiscall csv::icu::StringDataSource::next(StringDataSource *this)

{
  int iVar1;
  bool bVar2;
  char16_t cVar3;
  int32_t iVar4;
  StringDataSource *this_local;
  
  this->_offset = this->_offset + 1;
  iVar1 = this->_offset;
  iVar4 = icu_70::UnicodeString::length(&this->_in);
  bVar2 = iVar1 < iVar4;
  if (bVar2) {
    (this->super_DataSource)._prev = (this->super_DataSource)._current;
    cVar3 = icu_70::UnicodeString::operator[](&this->_in,this->_offset);
    (this->super_DataSource)._current = (uint)(ushort)cVar3;
  }
  return bVar2;
}

Assistant:

bool StringDataSource::next() {
		_offset++;
		if (_offset >= _in.length()) {
			return false;
		}

		_prev = _current;
		_current = _in[_offset];
		return true;
	}